

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_values.cc
# Opt level: O3

bool __thiscall bssl::der::ParseVisibleString(der *this,Input in,string *out)

{
  uchar *puVar1;
  
  if (in.data_.data_ != (uchar *)0x0) {
    puVar1 = (uchar *)0x0;
    do {
      if (0x5e < (byte)((char)this[(long)puVar1] - 0x20U)) {
        return false;
      }
      puVar1 = puVar1 + 1;
    } while (in.data_.data_ != puVar1);
  }
  ::std::__cxx11::string::_M_replace(in.data_.size_,0,*(char **)(in.data_.size_ + 8),(ulong)this);
  return true;
}

Assistant:

bool ParseVisibleString(Input in, std::string *out) {
  // ITU-T X.680:
  // VisibleString : "Defining registration number 6" + SPACE
  // 6 includes all the characters from '!' .. '~' (33 .. 126), space is 32.
  // Also ITU-T X.691 says it much more clearly:
  // "for VisibleString [the range] is 32 to 126 ... For VisibleString .. all
  // the values in the range are present."
  for (uint8_t c : in) {
    if (c < 32 || c > 126) {
      return false;
    }
  }
  *out = BytesAsStringView(in);
  return true;
}